

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O2

void dlib::impl1::connect_all
               (map_id_to_con *cons,
               vector<dlib::network_address,_std::allocator<dlib::network_address>_> *hosts,
               unsigned_long node_id)

{
  long lVar1;
  __uniq_ptr_data<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>,_true,_true> this;
  unsigned_long uVar2;
  long lVar3;
  unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> con;
  unsigned_long id;
  unsigned_long node_id_local;
  
  node_id_local = node_id;
  binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
  ::clear((binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
           *)(cons + 0x10));
  uVar2 = 1;
  lVar3 = 0;
  while( true ) {
    lVar1 = *(long *)hosts;
    if ((ulong)((*(long *)(hosts + 8) - lVar1) / 0x28) <= uVar2 - 1) break;
    this.super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>.
    _M_t.super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>.
    super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl =
         (__uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>)
         operator_new(400);
    bsp_con::bsp_con((bsp_con *)
                     this.
                     super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
                     .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl,
                     (network_address *)(lVar1 + lVar3));
    con._M_t.super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
    ._M_t.super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
    .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl =
         (__uniq_ptr_data<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>,_true,_true>
          )(__uniq_ptr_data<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>,_true,_true>
            )this.
             super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
             ._M_t.
             super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
             .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl;
    dlib::serialize(&node_id_local,
                    (ostream *)
                    ((long)this.
                           super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
                           .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl + 0x78
                    ));
    id = uVar2;
    map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
    ::add(cons,&id,&con);
    std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>::~unique_ptr
              (&con);
    lVar3 = lVar3 + 0x28;
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void connect_all (
            map_id_to_con& cons,
            const std::vector<network_address>& hosts,
            unsigned long node_id
        )
        {
            cons.clear();
            for (unsigned long i = 0; i < hosts.size(); ++i)
            {
                std::unique_ptr<bsp_con> con(new bsp_con(hosts[i]));
                dlib::serialize(node_id, con->stream); // tell the other end our node_id
                unsigned long id = i+1;
                cons.add(id, con);
            }
        }